

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::AssignInst::useVars(AssignInst *this)

{
  char *pcVar1;
  int __c;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *in_RSI;
  value_type *in_RDI;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *s;
  value_type *__x;
  
  pcVar1 = (char *)0x0;
  __x = in_RDI;
  memset(in_RDI,0,0x30);
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x2bfdc0);
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)
                      &(in_RSI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right,pcVar1,__c);
  if (pcVar1 == (char *)0x1) {
    std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x2bfde6);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    insert(in_RSI,__x);
  }
  return (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
         in_RDI;
}

Assistant:

std::set<VarId> useVars() const {
    auto s = std::set<VarId>();
    if (src.index() == 1) {
      s.insert(std::get<VarId>(src));
    }
    return s;
  }